

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phpconvert.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  AppParams *params;
  AppManager *this;
  ostream *poVar1;
  char *unaff_R15;
  exception ex;
  Bench b;
  AppParams local_70;
  
  phpconvert::Bench::Bench(&b);
  phpconvert::Bench::setStart(&b);
  local_70.path._M_dataplus._M_p = (pointer)&local_70.path.field_2;
  local_70.recursive = false;
  local_70._33_7_ = 0;
  local_70.outputPath._M_string_length = 0;
  local_70.outputPath.field_2._8_8_ = 0;
  local_70.valid = false;
  local_70._73_7_ = 0;
  local_70.path.field_2._M_allocated_capacity = 0;
  local_70.path.field_2._8_8_ = 0;
  local_70.path._M_string_length = 0;
  _ex = &__cxxabiv1::__pointer_type_info::vtable;
  local_70.outputPath._M_dataplus._M_p = (pointer)&local_70.outputPath.field_2;
  local_70.outputPath.field_2._M_allocated_capacity = 0;
  params = phpconvert::AppParams::createFromRequest(&local_70,argc,argv);
  phpconvert::AppParams::~AppParams(&local_70);
  this = (AppManager *)operator_new(0x10);
  phpconvert::AppManager::AppManager(this);
  phpconvert::AppManager::run(this,params);
  std::operator<<((ostream *)&std::cout,unaff_R15);
  if (params != (AppParams *)0x0) {
    phpconvert::AppParams::~AppParams(params);
  }
  operator_delete(params);
  (*this->_vptr_AppManager[1])(this);
  phpconvert::Bench::setStop(&b);
  phpconvert::Bench::getDiff_abi_cxx11_(&local_70.path,&b);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_70);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_70);
  std::exception::~exception(&ex);
  phpconvert::Bench::~Bench(&b);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    Bench b;
    b.setStart();

    AppParams *appParams;
    AppManager *app;
    const char* message;
    exception ex;

    appParams = (AppParams()).createFromRequest(argc, argv);
    app = new AppManager();

    try {
        app->run(appParams);
    } catch (SystemException &e) {
        ex = e;
        message =  e.what();
    } catch (exception &e) { //ooopss ;)
        ex = e;
        message =   e.what();
    }

    cout << message;

    delete appParams;
    delete app;
//    delete message;

    b.setStop();
    cout << b.getDiff() << "\n";
    return 0;
}